

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O2

void Abc_NodeSopToCubes(Abc_Obj_t *pNodeOld,Abc_Ntk_t *pNtkNew,int fXor)

{
  byte *pSop;
  Mem_Flex_t *pMan;
  int iVar1;
  Abc_Obj_t *pAVar2;
  char *pcVar3;
  byte *pbVar4;
  Abc_Obj_t *pFanin;
  byte bVar5;
  int iVar6;
  byte *pbVar7;
  long lVar8;
  byte *pbVar9;
  
  pSop = (byte *)(pNodeOld->field_5).pData;
  iVar6 = (pNodeOld->vFanins).nSize;
  iVar1 = Abc_SopGetCubeNum((char *)pSop);
  if (iVar1 < 2) {
    pAVar2 = Abc_NtkDupObj(pNtkNew,pNodeOld,0);
    for (lVar8 = 0; lVar8 < (pNodeOld->vFanins).nSize; lVar8 = lVar8 + 1) {
      Abc_ObjAddFanin(pAVar2,*(Abc_Obj_t **)
                              ((long)pNodeOld->pNtk->vObjs->pArray
                                     [(pNodeOld->vFanins).pArray[lVar8]] + 0x40));
    }
    if ((Abc_Obj_t *)(pNodeOld->field_6).pTemp != pAVar2) {
      __assert_fail("pNodeOld->pCopy == pNodeNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                    ,0x9ee,"void Abc_NodeSopToCubes(Abc_Obj_t *, Abc_Ntk_t *, int)");
    }
  }
  else {
    pAVar2 = Abc_NtkCreateNode(pNtkNew);
    pMan = (Mem_Flex_t *)pNtkNew->pManFunc;
    iVar1 = Abc_SopGetCubeNum((char *)pSop);
    if (fXor == 0) {
      pcVar3 = Abc_SopCreateOr(pMan,iVar1,(int *)0x0);
    }
    else {
      pcVar3 = Abc_SopCreateXorSpecial(pMan,iVar1);
    }
    (pAVar2->field_5).pData = pcVar3;
    iVar6 = iVar6 + 3;
    pbVar7 = pSop + 1;
    for (pbVar9 = pSop; bVar5 = *pbVar9, bVar5 != 0; pbVar9 = pbVar9 + iVar6) {
      iVar1 = 0;
      pbVar4 = pbVar7;
      while ((bVar5 & 0xdf) != 0) {
        iVar1 = iVar1 + (uint)((bVar5 & 0xfe) == 0x30);
        bVar5 = *pbVar4;
        pbVar4 = pbVar4 + 1;
      }
      if (iVar1 == 0) {
        pFanin = Abc_NtkCreateNodeConst1(pNtkNew);
      }
      else {
        pFanin = Abc_NtkCreateNode(pNtkNew);
        pcVar3 = Abc_SopCreateAnd((Mem_Flex_t *)pNtkNew->pManFunc,iVar1,(int *)0x0);
        (pFanin->field_5).pData = pcVar3;
        iVar1 = 0;
        for (lVar8 = 0; bVar5 = pbVar9[lVar8], (bVar5 & 0xdf) != 0; lVar8 = lVar8 + 1) {
          if (0xfd < (byte)(bVar5 - 0x32)) {
            Abc_ObjAddFanin(pFanin,*(Abc_Obj_t **)
                                    ((long)pNodeOld->pNtk->vObjs->pArray
                                           [(pNodeOld->vFanins).pArray[lVar8]] + 0x40));
            if (bVar5 == 0x30) {
              Abc_SopComplementVar((char *)(pFanin->field_5).pData,iVar1);
            }
            iVar1 = iVar1 + 1;
          }
        }
      }
      Abc_ObjAddFanin(pAVar2,pFanin);
      pbVar7 = pbVar7 + iVar6;
    }
    iVar6 = Abc_SopIsComplement((char *)pSop);
    if (iVar6 != 0) {
      Abc_SopComplement((char *)(pAVar2->field_5).pData);
    }
    if ((pNodeOld->field_6).pTemp != (void *)0x0) {
      __assert_fail("pNodeOld->pCopy == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                    ,0xa18,"void Abc_NodeSopToCubes(Abc_Obj_t *, Abc_Ntk_t *, int)");
    }
    (pNodeOld->field_6).pCopy = pAVar2;
  }
  return;
}

Assistant:

void Abc_NodeSopToCubes( Abc_Obj_t * pNodeOld, Abc_Ntk_t * pNtkNew, int fXor )
{
    Abc_Obj_t * pNodeOr, * pNodeNew, * pFanin;
    char * pCube, * pSop = (char *)pNodeOld->pData;
    int v, Value, nVars = Abc_ObjFaninNum(pNodeOld), nFanins;
    // create the root node
    if ( Abc_SopGetCubeNum(pSop) < 2 )
    {
        pNodeNew = Abc_NtkDupObj( pNtkNew, pNodeOld, 0 );
        Abc_ObjForEachFanin( pNodeOld, pFanin, v )
            Abc_ObjAddFanin( pNodeNew, pFanin->pCopy );
        assert( pNodeOld->pCopy == pNodeNew );
        return;
    }
    // add the OR gate
    pNodeOr = Abc_NtkCreateNode( pNtkNew );
    if ( fXor )
        pNodeOr->pData = Abc_SopCreateXorSpecial( (Mem_Flex_t *)pNtkNew->pManFunc, Abc_SopGetCubeNum(pSop) );
    else 
        pNodeOr->pData = Abc_SopCreateOr( (Mem_Flex_t *)pNtkNew->pManFunc, Abc_SopGetCubeNum(pSop), NULL );
    // check the logic function of the node
    Abc_SopForEachCube( pSop, nVars, pCube )
    {
        nFanins = 0;
        Abc_CubeForEachVar( pCube, Value, v )
            if ( Value == '0' || Value == '1' )
                nFanins++;
        if ( nFanins == 0 ) // const1 cube in ESOP
        {
            pNodeNew = Abc_NtkCreateNodeConst1( pNtkNew );
            Abc_ObjAddFanin( pNodeOr, pNodeNew );
            continue;
        }
        assert( nFanins > 0 );
        // create node
        pNodeNew = Abc_NtkCreateNode( pNtkNew );
        pNodeNew->pData = Abc_SopCreateAnd( (Mem_Flex_t *)pNtkNew->pManFunc, nFanins, NULL );
        nFanins = 0;
        Abc_CubeForEachVar( pCube, Value, v )
        {
            if ( Value != '0' && Value != '1' )
                continue;
            Abc_ObjAddFanin( pNodeNew, Abc_ObjFanin(pNodeOld, v)->pCopy );
            if ( Value == '0' )
                Abc_SopComplementVar( (char *)pNodeNew->pData, nFanins );
            nFanins++;
        }
        Abc_ObjAddFanin( pNodeOr, pNodeNew );
    }
    // check the complement
    if ( Abc_SopIsComplement(pSop) )
        Abc_SopComplement( (char *)pNodeOr->pData );
    // mark the old node with the new one
    assert( pNodeOld->pCopy == NULL );
    pNodeOld->pCopy = pNodeOr;
}